

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O0

void __thiscall KDReports::Test::testExportAsSinglePage(Test *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  AutoTableElement *pAVar4;
  reference t1;
  int __oflag;
  QFont *__file;
  double dVar5;
  QRect local_128;
  QList<QRect> local_118;
  QSize local_fc;
  QFlags<Qt::ImageConversionFlag> local_f4;
  undefined1 local_f0 [8];
  QPixmap pix;
  QSize QStack_c8;
  bool ok;
  QSize size;
  QString filename;
  QTemporaryFile local_a0 [8];
  QTemporaryFile tempFile;
  QLatin1String local_90;
  QString local_80;
  QFont local_68 [8];
  QFont font;
  AutoTableElement local_58 [48];
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  fillModel(this,1,0x28,false);
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  pAVar4 = (AutoTableElement *)KDReports::Report::mainTable();
  KDReports::AutoTableElement::AutoTableElement(local_58,(QAbstractItemModel *)&this->m_model);
  KDReports::MainTable::setAutoTableElement(pAVar4);
  KDReports::AutoTableElement::~AutoTableElement(local_58);
  KDReports::Report::scaleTo((int)local_28,1);
  QLatin1String::QLatin1String(&local_90,"Noto Sans");
  QString::QString(&local_80,local_90);
  QFont::QFont(local_68,&local_80,-1,-1,false);
  QString::~QString(&local_80);
  QFont::setPointSize((int)local_68);
  __file = local_68;
  KDReports::Report::setDefaultFont((QFont *)local_28);
  QTemporaryFile::QTemporaryFile(local_a0);
  iVar3 = QTemporaryFile::open(local_a0,(char *)__file,__oflag);
  bVar1 = QTest::qVerify((bool)((byte)iVar3 & 1),"tempFile.open()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                         ,0x21d);
  if ((bVar1 & 1) != 0) {
    QTemporaryFile::fileName();
    QFileDevice::close();
    QSize::QSize(&stack0xffffffffffffff38,1000,2000);
    bVar1 = KDReports::Report::exportToImage((QSize)local_28,(QString *)QStack_c8,(char *)&size);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"ok","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x222);
    if ((bVar1 & 1) != 0) {
      bVar1 = QFile::exists((QString *)&size);
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"QFile::exists(filename)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x223);
      if ((bVar1 & 1) != 0) {
        QPixmap::QPixmap((QPixmap *)local_f0);
        QFlags<Qt::ImageConversionFlag>::QFlags(&local_f4,AutoColor);
        bVar1 = QPixmap::load((QString *)local_f0,(char *)&size,(QFlags_conflict *)0x0);
        bVar1 = QTest::qVerify((bool)(bVar1 & 1),"pix.load(filename)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x225);
        if ((bVar1 & 1) != 0) {
          local_fc = (QSize)QPixmap::size();
          bVar2 = QTest::qCompare<QSize,QSize>
                            (&local_fc,&stack0xffffffffffffff38,"pix.size()","size",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x226);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            KDReports::Report::mainTable();
            KDReports::MainTable::pageRects();
            t1 = QList<QRect>::operator[](&local_118,0);
            QRect::QRect(&local_128,0,0,1,0x28);
            bVar2 = QTest::qCompare<QRect,QRect>
                              (t1,&local_128,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 1, 40)",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x228);
            QList<QRect>::~QList(&local_118);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              KDReports::Report::mainTable();
              dVar5 = (double)KDReports::MainTable::lastAutoFontScalingFactor();
              bVar1 = QTest::qVerify(0.9999 < dVar5,
                                     "report.mainTable()->lastAutoFontScalingFactor() > 0.9999","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x229);
              if ((bVar1 & 1) != 0) {
                QFile::remove((QString *)&size);
              }
            }
          }
        }
        QPixmap::~QPixmap((QPixmap *)local_f0);
      }
    }
    QString::~QString((QString *)&size);
  }
  QTemporaryFile::~QTemporaryFile(local_a0);
  QFont::~QFont(local_68);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testExportAsSinglePage()
    {
        // Same testcase as testVerticalScaling, for now
        fillModel(1, 40);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.mainTable()->setAutoTableElement(AutoTableElement(&m_model));
        report.scaleTo(1, 2); // must cram 40 rows into 2 page vertically
        QFont font = QFont(QLatin1String(s_fontName));
        font.setPointSize(86); // huge :)
        report.setDefaultFont(font);
        // QCOMPARE(report.numberOfPages(), 2);

        // report.exportToFile( "testExportAsSinglePage.pdf" ); // for debugging

        QTemporaryFile tempFile;
        QVERIFY(tempFile.open());
        const QString filename = tempFile.fileName();
        tempFile.close();
        const QSize size(1000, 2000);
        bool ok = report.exportToImage(size, filename, "PNG");
        QVERIFY(ok);
        QVERIFY(QFile::exists(filename));
        QPixmap pix;
        QVERIFY(pix.load(filename));
        QCOMPARE(pix.size(), size);

        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 1, 40));
        QVERIFY(report.mainTable()->lastAutoFontScalingFactor() > 0.9999);
        // The only way to truly validate that it worked, though, is to open test-export.jpg and check...

        QFile::remove(filename);
    }